

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_slerp(rf_quaternion q1,rf_quaternion q2,float amount)

{
  rf_quaternion rVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  rf_quaternion rVar7;
  float ratioB;
  float ratioA;
  float sinHalfTheta;
  float halfTheta;
  float cosHalfTheta;
  float amount_local;
  rf_quaternion q2_local;
  rf_quaternion q1_local;
  rf_quaternion result;
  
  q2_local.z = q1.x;
  q2_local.w = q1.y;
  q1_local.x = q1.z;
  q1_local.y = q1.w;
  cosHalfTheta = q2.x;
  amount_local = q2.y;
  q2_local.x = q2.z;
  q2_local.y = q2.w;
  memset(&q1_local.z,0,0x10);
  fVar2 = q1_local.y * q2_local.y +
          q1_local.x * q2_local.x + q2_local.z * cosHalfTheta + q2_local.w * amount_local;
  if (ABS(fVar2) < 1.0) {
    if (fVar2 <= 0.95) {
      dVar5 = acos((double)fVar2);
      dVar6 = sqrt((double)(-fVar2 * fVar2 + 1.0));
      fVar2 = (float)dVar6;
      if (0.001 <= ABS(fVar2)) {
        fVar3 = sinf((1.0 - amount) * (float)dVar5);
        fVar3 = fVar3 / fVar2;
        fVar4 = sinf(amount * (float)dVar5);
        fVar4 = fVar4 / fVar2;
        q1_local.z = q2_local.z * fVar3 + cosHalfTheta * fVar4;
        q1_local.w = q2_local.w * fVar3 + amount_local * fVar4;
        result.x = q1_local.x * fVar3 + q2_local.x * fVar4;
        result.y = q1_local.y * fVar3 + q2_local.y * fVar4;
      }
      else {
        q1_local.z = q2_local.z * 0.5 + cosHalfTheta * 0.5;
        q1_local.w = q2_local.w * 0.5 + amount_local * 0.5;
        result.x = q1_local.x * 0.5 + q2_local.x * 0.5;
        result.y = q1_local.y * 0.5 + q2_local.y * 0.5;
      }
    }
    else {
      rVar7.z = q1_local.x;
      rVar7.x = (float)(int)q1._0_8_;
      rVar7.y = (float)(int)((ulong)q1._0_8_ >> 0x20);
      rVar7.w = q1_local.y;
      rVar7 = rf_quaternion_nlerp(rVar7,q2,amount);
      q1_local.z = rVar7.x;
      q1_local.w = rVar7.y;
      result.x = rVar7.z;
      result.y = rVar7.w;
    }
  }
  else {
    result.x = q1_local.x;
    result.y = q1_local.y;
    q1_local.z = q2_local.z;
    q1_local.w = q2_local.w;
  }
  rVar1.y = q1_local.w;
  rVar1.x = q1_local.z;
  rVar1.z = result.x;
  rVar1.w = result.y;
  return rVar1;
}

Assistant:

RF_API rf_quaternion rf_quaternion_slerp(rf_quaternion q1, rf_quaternion q2, float amount)
{
    rf_quaternion result = {0};

    float cosHalfTheta = q1.x * q2.x + q1.y * q2.y + q1.z * q2.z + q1.w * q2.w;

    if (fabs(cosHalfTheta) >= 1.0f) result = q1;
    else if (cosHalfTheta > 0.95f) result = rf_quaternion_nlerp(q1, q2, amount);
    else
    {
        float halfTheta = (float) acos(cosHalfTheta);
        float sinHalfTheta = (float) sqrt(1.0f - cosHalfTheta * cosHalfTheta);

        if (fabs(sinHalfTheta) < 0.001f)
        {
            result.x = (q1.x * 0.5f + q2.x * 0.5f);
            result.y = (q1.y * 0.5f + q2.y * 0.5f);
            result.z = (q1.z * 0.5f + q2.z * 0.5f);
            result.w = (q1.w * 0.5f + q2.w * 0.5f);
        } else
        {
            float ratioA = sinf((1 - amount) * halfTheta) / sinHalfTheta;
            float ratioB = sinf(amount * halfTheta) / sinHalfTheta;

            result.x = (q1.x * ratioA + q2.x * ratioB);
            result.y = (q1.y * ratioA + q2.y * ratioB);
            result.z = (q1.z * ratioA + q2.z * ratioB);
            result.w = (q1.w * ratioA + q2.w * ratioB);
        }
    }

    return result;
}